

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void MarkReachableBlocks(VmBlock *block)

{
  ulong uVar1;
  
  if ((block->visited == false) && (block->visited = true, (block->successors).count != 0)) {
    uVar1 = 0;
    do {
      MarkReachableBlocks((block->successors).data[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (block->successors).count);
  }
  return;
}

Assistant:

void MarkReachableBlocks(VmBlock *block)
{
	if(block->visited)
		return;

	block->visited = true;

	for(unsigned i = 0; i < block->successors.size(); i++)
		MarkReachableBlocks(block->successors[i]);
}